

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.cpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationZ<std::complex<double>_>::apply
          (RotationZ<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  anon_class_40_3_96b6a9c1 f;
  undefined1 local_50 [24];
  double local_38;
  double local_30;
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  local_50._8_8_ = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
  local_30 = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
  local_50._0_8_ =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  uVar2 = SUB84(local_30,0);
  uVar3 = (uint)((ulong)local_30 >> 0x20);
  uVar4 = uVar3 ^ 0x80000000;
  if (op == ConjTrans) {
    local_30 = -local_30;
    uVar4 = uVar3;
  }
  local_50._20_4_ = uVar4;
  local_50._16_4_ = uVar2;
  local_38 = (double)local_50._8_8_;
  apply2<qclab::qgates::lambda_RotationZ<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,(anon_class_40_3_96b6a9c1 *)local_50);
  return;
}

Assistant:

void RotationZ< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationZ( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }